

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

unsigned_long __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::PushElement<unsigned_int,unsigned_long>
          (FlatBufferBuilderImpl<true> *this,uint element)

{
  unsigned_long uVar1;
  uint local_14;
  
  Align(this,4);
  vector_downward<unsigned_long>::push_small<unsigned_int>(&this->buf_,&local_14);
  uVar1 = (this->buf_).size_;
  this->length_of_64_bit_region_ = uVar1;
  return uVar1;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }